

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glSetVertexShaderUniformI(uint idx,int *data,uint ivec4n)

{
  uint uVar1;
  uint cpy;
  uint maxregs;
  uint ivec4n_local;
  int *data_local;
  uint idx_local;
  
  if (idx < 0x7ff) {
    uVar1 = minuint(0x7ff - idx,ivec4n);
    memcpy(ctx->vs_reg_file_i + (idx << 2),data,(ulong)(uVar1 << 4));
    ctx->generation = ctx->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetVertexShaderUniformI(unsigned int idx, const int *data,
                                          unsigned int ivec4n)
{
    const uint maxregs = STATICARRAYLEN(ctx->vs_reg_file_i) / 4;
    if (idx < maxregs)
    {
        assert(sizeof (GLint) == sizeof (int));
        const uint cpy = (minuint(maxregs - idx, ivec4n) * sizeof (*data)) * 4;
        memcpy(ctx->vs_reg_file_i + (idx * 4), data, cpy);
        ctx->generation++;
    } // if
}